

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# error_reporting.cpp
# Opt level: O2

void __thiscall
pstore::http::report_error
          (http *this,error_code error,request_info *request,socket_descriptor *socket)

{
  error_category *peVar1;
  error_category *peVar2;
  ostream *poVar3;
  reference socket_00;
  czstring text;
  char *message_00;
  http_status_code code;
  span<const_char,__1L> sVar4;
  error_code eVar5;
  span<const_char,__1L> s;
  error_code erc;
  span<const_char,__1L> s_00;
  error_code error_local;
  string h;
  anon_class_24_3_b371a401 report;
  error_or<pstore::details::descriptor<pstore::details::posix_descriptor_traits>_&> local_240;
  error_or<pstore::details::descriptor<pstore::details::posix_descriptor_traits>_&> local_228;
  array<std::pair<const_char_*,_const_char_*>,_1UL> headers;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_200;
  string response_string;
  storage_type<pstore::gsl::details::extent_type<_1L>_> local_1c0;
  storage_type<pstore::gsl::details::extent_type<_1L>_> local_1b0;
  error_or<std::reference_wrapper<pstore::details::descriptor<pstore::details::posix_descriptor_traits>_>_>
  local_1a0;
  ostringstream message;
  
  report.request = (request_info *)error._M_cat;
  error_local._M_cat = error._0_8_;
  report.error = &error_local;
  error_local._M_value = (int)this;
  text = *(czstring *)error_local._M_cat;
  report.socket = (socket_descriptor *)request;
  (**(code **)(text + 0x20))(&local_200,error_local._M_cat,(ulong)this & 0xffffffff);
  log<std::__cxx11::string>(error,"http error: ",&local_200);
  std::__cxx11::string::~string((string *)&local_200);
  peVar1 = error_local._M_cat;
  peVar2 = get_error_category();
  if (peVar1 == peVar2) {
    if (error_local._M_value == 1) {
      message_00 = "Bad request";
      code = bad_request;
    }
    else {
      if (error_local._M_value == 2) {
        build_status_line_abi_cxx11_(&response_string,(http *)0x1aa,0x125a0d,text);
        sVar4 = pstore::gsl::make_span<std::__cxx11::string>(&response_string);
        s.storage_.data_ = (index_type)sVar4.storage_.data_;
        s.storage_.super_extent_type<_1L>.size_ = s.storage_.data_;
        local_1c0 = (storage_type<pstore::gsl::details::extent_type<_1L>_>)
                    pstore::gsl::as_bytes<char_const,_1l>
                              ((gsl *)sVar4.storage_.super_extent_type<_1L>.size_.size_,s);
        net::network_sender(&local_240,(socket_descriptor *)request,
                            (span<const_unsigned_char,__1L> *)&local_1c0);
        if (local_240.has_error_ == false) {
          socket_00 = error_or<pstore::details::descriptor<pstore::details::posix_descriptor_traits>_&>
                      ::operator*(&local_240);
          std::__cxx11::to_string((string *)&message,0xd);
          headers._M_elems[0].first = "Sec-WebSocket-Version";
          headers._M_elems[0].second = _message;
          build_headers<std::pair<char_const*,char_const*>const*,void>
                    (&h,(http *)&headers,(pair<const_char_*,_const_char_*> *)&local_200,
                     (pair<const_char_*,_const_char_*> *)"Sec-WebSocket-Version");
          sVar4 = pstore::gsl::make_span<std::__cxx11::string>(&h);
          s_00.storage_.data_ = (index_type)sVar4.storage_.data_;
          s_00.storage_.super_extent_type<_1L>.size_ = s_00.storage_.data_;
          local_1b0 = (storage_type<pstore::gsl::details::extent_type<_1L>_>)
                      pstore::gsl::as_bytes<char_const,_1l>
                                ((gsl *)sVar4.storage_.super_extent_type<_1L>.size_.size_,s_00);
          net::network_sender(&local_228,socket_00,(span<const_unsigned_char,__1L> *)&local_1b0);
          std::__cxx11::string::~string((string *)&h);
          std::__cxx11::string::~string((string *)&message);
        }
        else {
          eVar5 = error_or<pstore::details::descriptor<pstore::details::posix_descriptor_traits>_&>
                  ::get_error(&local_240);
          erc._M_cat = eVar5._M_cat;
          erc._4_4_ = 0;
          erc._M_value = eVar5._M_value;
          error_or<pstore::details::descriptor<pstore::details::posix_descriptor_traits>_&>::
          error_or(&local_228,erc);
        }
        error_or<std::reference_wrapper<pstore::details::descriptor<pstore::details::posix_descriptor_traits>>>
        ::error_or<pstore::details::descriptor<pstore::details::posix_descriptor_traits>&,void>
                  (&local_1a0,&local_228);
        error_or<pstore::details::descriptor<pstore::details::posix_descriptor_traits>_&>::~error_or
                  (&local_228);
        error_or<pstore::details::descriptor<pstore::details::posix_descriptor_traits>_&>::~error_or
                  (&local_240);
        std::__cxx11::string::~string((string *)&response_string);
        error_or<std::reference_wrapper<pstore::details::descriptor<pstore::details::posix_descriptor_traits>_>_>
        ::~error_or(&local_1a0);
        return;
      }
      if (error_local._M_value != 3) goto LAB_00115951;
      message_00 = "Not implemented";
      code = not_implemented;
    }
  }
  else {
    peVar2 = &romfs::get_romfs_error_category()->super_error_category;
    if ((peVar1 != peVar2) || ((error_local._M_value != 0x14 && (error_local._M_value != 2)))) {
LAB_00115951:
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&message);
      poVar3 = std::operator<<((ostream *)&message,"Server internal error: ");
      (**(code **)(*(long *)error_local._M_cat + 0x20))(&h,error_local._M_cat,error_local._M_value);
      std::operator<<(poVar3,(string *)&h);
      std::__cxx11::string::~string((string *)&h);
      std::__cxx11::stringbuf::str();
      report_error::anon_class_24_3_b371a401::operator()
                (&report,internal_server_error,h._M_dataplus._M_p);
      std::__cxx11::string::~string((string *)&h);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&message);
      return;
    }
    message_00 = "Not found";
    code = not_found;
  }
  report_error::anon_class_24_3_b371a401::operator()(&report,code,message_00);
  return;
}

Assistant:

void report_error (std::error_code const error, request_info const & request,
                           socket_descriptor & socket) {
            static constexpr auto sender = net::network_sender;

            auto const report = [&] (http_status_code const code, gsl::czstring const message) {
                send_error_page (sender, std::ref (socket), request.uri ().c_str (), code, message,
                                 error.message ().c_str ());
            };

            log (logger::priority::error, "http error: ", error.message ());
            auto const & cat = error.category ();
            if (cat == get_error_category ()) {
                switch (static_cast<error_code> (error.value ())) {
                case error_code::bad_request:
                    return report (http_status_code::bad_request, "Bad request");

                case error_code::bad_websocket_version:
                    send_bad_websocket_version (sender, std::ref (socket));
                    return;

                case error_code::not_implemented:
                    return report (http_status_code::not_implemented, "Not implemented");

                case error_code::string_too_long:
                case error_code::refill_out_of_range: break;
                }
            } else if (cat == romfs::get_romfs_error_category ()) {
                switch (static_cast<romfs::error_code> (error.value ())) {
                case romfs::error_code::enoent:
                case romfs::error_code::enotdir:
                    return report (http_status_code::not_found, "Not found");

                case romfs::error_code::einval: break;
                }
            }

            // Some error that we don't know how to report properly.
            std::ostringstream message;
            message << "Server internal error: " << error.message ();
            report (http_status_code::internal_server_error, message.str ().c_str ());
        }